

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void boost::unordered::detail::foa::rw_spinlock::yield(uint k)

{
  uint uVar1;
  uint in_EDI;
  uint i;
  uint pause_count;
  uint sleep_every;
  undefined4 local_10;
  
  uVar1 = in_EDI & 0x3ff;
  if (uVar1 < 5) {
    for (local_10 = 0; local_10 < (uint)(1 << ((byte)uVar1 & 0x1f)); local_10 = local_10 + 1) {
    }
  }
  else if (uVar1 < 0x3ff) {
    core::sp_thread_yield();
  }
  else {
    core::sp_thread_sleep();
  }
  return;
}

Assistant:

static void yield(unsigned k) noexcept {
        unsigned const sleep_every = 1024; // see below

        k %= sleep_every;

        if (k < 5) {
            // Intel recommendation from the Optimization Reference Manual
            // Exponentially increase number of PAUSE instructions each
            // iteration until reaching a maximum which is approximately
            // one timeslice long (2^4 == 16 in our case)

            unsigned const pause_count = 1u << k;

            for (unsigned i = 0; i < pause_count; ++i) {
                boost::core::sp_thread_pause();
            }
        }
        else if (k < sleep_every - 1) {
            // Once the maximum number of PAUSE instructions is reached,
            // we switch to yielding the timeslice immediately

            boost::core::sp_thread_yield();
        }
        else {
            // After `sleep_every` iterations of no progress, we sleep,
            // to avoid a deadlock if a lower priority thread has the lock

            boost::core::sp_thread_sleep();
        }
    }